

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_refs.c
# Opt level: O3

size_t refs_count(refs_table_t *tbl)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  
  if (tbl->refs_size != 0) {
    lVar3 = 0;
    sVar2 = 0;
    do {
      lVar1 = *(long *)((long)tbl->refs_table + lVar3);
      if ((lVar1 != 0) && (lVar1 != 0x7fffffffffffffff)) {
        sVar2 = sVar2 + 1;
      }
      lVar3 = lVar3 + 8;
    } while (tbl->refs_size << 3 != lVar3);
    return sVar2;
  }
  return 0;
}

Assistant:

size_t
refs_count(refs_table_t *tbl)
{
    size_t count = 0;
    _Atomic(uint64_t) *bucket = tbl->refs_table;
    _Atomic(uint64_t) * const end = bucket + tbl->refs_size;
    while (bucket != end) {
        uint64_t d = atomic_load_explicit(bucket, memory_order_relaxed);
        if (d != 0 && d != refs_ts) count++;
        bucket++;
    }
    return count;
}